

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O1

bool __thiscall
HighsDomain::ConflictSet::explainBoundChangeGeq
          (ConflictSet *this,
          set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
          *currentFrontier,LocalDomChg *domchg,HighsInt *inds,double *vals,HighsInt len,double rhs,
          double maxAct)

{
  _Rb_tree_header *p_Var1;
  pointer *ppRVar2;
  _Base_ptr p_Var3;
  pointer pRVar4;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var5;
  HighsDomain *pHVar6;
  pointer ppVar7;
  pointer pdVar8;
  iterator __position;
  pointer pRVar9;
  HighsMipSolver *pHVar10;
  bool bVar11;
  long lVar12;
  double *pdVar13;
  int iVar14;
  _Base_ptr p_Var15;
  NodeSetArray *pNVar16;
  long lVar17;
  ulong uVar18;
  pointer ppVar19;
  _Base_ptr p_Var20;
  int *piVar21;
  set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
  *psVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  undefined8 uVar29;
  HighsCDouble M;
  ResolveCandidate local_90;
  set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
  *local_70;
  double local_68;
  undefined8 uStack_60;
  double local_50;
  vector<HighsDomain::ConflictSet::ResolveCandidate,std::allocator<HighsDomain::ConflictSet::ResolveCandidate>>
  *local_48;
  NodeSetArray *local_40;
  NodeSetArray *local_38;
  
  if (maxAct < INFINITY) {
    local_48 = (vector<HighsDomain::ConflictSet::ResolveCandidate,std::allocator<HighsDomain::ConflictSet::ResolveCandidate>>
                *)&this->resolveBuffer;
    local_70 = currentFrontier;
    local_50 = rhs;
    std::
    vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
    ::reserve((vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
               *)local_48,(long)len);
    pRVar4 = (this->resolveBuffer).
             super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->resolveBuffer).
        super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
        ._M_impl.super__Vector_impl_data._M_finish != pRVar4) {
      (this->resolveBuffer).
      super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
      ._M_impl.super__Vector_impl_data._M_finish = pRVar4;
    }
    if (len < 1) {
      dVar23 = 0.0;
      dVar27 = 0.0;
      uVar29 = 0;
    }
    else {
      _Var5._M_head_impl =
           (this->localdom->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
      p_Var1 = &(local_70->_M_t)._M_impl.super__Rb_tree_header;
      local_40 = (NodeSetArray *)((long)&(_Var5._M_head_impl)->nodequeue + 0x40);
      local_38 = (NodeSetArray *)((long)&(_Var5._M_head_impl)->nodequeue + 0x48);
      uVar18 = 0;
      dVar27 = 0.0;
      uVar29 = 0;
      dVar23 = 0.0;
      psVar22 = local_70;
      dVar26 = maxAct;
      do {
        lVar12 = (long)inds[uVar18];
        maxAct = dVar26;
        if (inds[uVar18] == (domchg->domchg).column) {
          dVar27 = vals[uVar18];
          uVar29 = 0;
        }
        else {
          local_90.valuePos = (HighsInt)uVar18;
          dVar24 = vals[uVar18];
          pHVar6 = this->localdom;
          ppVar7 = (pHVar6->prevboundval_).
                   super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (dVar24 <= 0.0) {
            ppVar19 = (pointer)((pHVar6->col_lower_).
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start + lVar12);
            piVar21 = (pHVar6->colLowerPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar12;
            while( true ) {
              dVar28 = ppVar19->first;
              local_90.boundPos = *piVar21;
              if ((local_90.boundPos <= domchg->pos) &&
                 (((local_90.boundPos == -1 || (ppVar7[local_90.boundPos].first != dVar28)) ||
                  (NAN(ppVar7[local_90.boundPos].first) || NAN(dVar28))))) break;
              ppVar19 = ppVar7 + local_90.boundPos;
              piVar21 = &ppVar7[local_90.boundPos].second;
            }
            if (local_90.boundPos != -1) {
              pdVar8 = (this->globaldom->col_lower_).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              p_Var3 = (_Base_ptr)pdVar8[lVar12];
              if ((double)p_Var3 < dVar28) {
                p_Var20 = (psVar22->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
                p_Var15 = &p_Var1->_M_header;
                for (; p_Var20 != (_Base_ptr)0x0;
                    p_Var20 = (&p_Var20->_M_left)[(int)p_Var20[1]._M_color < local_90.boundPos]) {
                  if (local_90.boundPos <= (int)p_Var20[1]._M_color) {
                    p_Var15 = p_Var20;
                  }
                }
                p_Var20 = &p_Var1->_M_header;
                if (((_Rb_tree_header *)p_Var15 != p_Var1) &&
                   (p_Var20 = p_Var15, local_90.boundPos < (int)p_Var15[1]._M_color)) {
                  p_Var20 = &p_Var1->_M_header;
                }
                pdVar13 = pdVar8 + lVar12;
                local_90.baseBound = (double)p_Var3;
                if ((_Rb_tree_header *)p_Var20 != p_Var1) {
                  local_90.baseBound = (double)p_Var20[1]._M_parent;
                  dVar25 = *pdVar13;
                  if ((local_90.baseBound != dVar25) || (NAN(local_90.baseBound) || NAN(dVar25))) {
                    dVar25 = (local_90.baseBound - dVar25) * dVar24;
                    maxAct = dVar26 + dVar25;
                    dVar23 = dVar23 + (dVar26 - (maxAct - dVar25)) +
                                      (dVar25 - (maxAct - (maxAct - dVar25)));
                  }
                  if (dVar28 <= local_90.baseBound) goto LAB_0029d7ca;
                }
                local_90.delta = dVar28 - local_90.baseBound;
                pNVar16 = local_40;
                goto LAB_0029da5b;
              }
            }
          }
          else {
            ppVar19 = (pointer)((pHVar6->col_upper_).
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start + lVar12);
            piVar21 = (pHVar6->colUpperPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar12;
            while( true ) {
              dVar28 = ppVar19->first;
              local_90.boundPos = *piVar21;
              if ((local_90.boundPos <= domchg->pos) &&
                 (((local_90.boundPos == -1 || (ppVar7[local_90.boundPos].first != dVar28)) ||
                  (NAN(ppVar7[local_90.boundPos].first) || NAN(dVar28))))) break;
              ppVar19 = ppVar7 + local_90.boundPos;
              piVar21 = &ppVar7[local_90.boundPos].second;
            }
            if (local_90.boundPos != -1) {
              pdVar8 = (this->globaldom->col_upper_).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              p_Var3 = (_Base_ptr)pdVar8[lVar12];
              if (dVar28 < (double)p_Var3) {
                p_Var20 = (psVar22->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
                p_Var15 = &p_Var1->_M_header;
                for (; p_Var20 != (_Base_ptr)0x0;
                    p_Var20 = (&p_Var20->_M_left)[(int)p_Var20[1]._M_color < local_90.boundPos]) {
                  if (local_90.boundPos <= (int)p_Var20[1]._M_color) {
                    p_Var15 = p_Var20;
                  }
                }
                p_Var20 = &p_Var1->_M_header;
                if (((_Rb_tree_header *)p_Var15 != p_Var1) &&
                   (p_Var20 = p_Var15, local_90.boundPos < (int)p_Var15[1]._M_color)) {
                  p_Var20 = &p_Var1->_M_header;
                }
                pdVar13 = pdVar8 + lVar12;
                local_90.baseBound = (double)p_Var3;
                if ((_Rb_tree_header *)p_Var20 != p_Var1) {
                  local_90.baseBound = (double)p_Var20[1]._M_parent;
                  dVar25 = *pdVar13;
                  if ((local_90.baseBound != dVar25) || (NAN(local_90.baseBound) || NAN(dVar25))) {
                    dVar25 = (local_90.baseBound - dVar25) * dVar24;
                    maxAct = dVar26 + dVar25;
                    dVar23 = dVar23 + (dVar26 - (maxAct - dVar25)) +
                                      (dVar25 - (maxAct - (maxAct - dVar25)));
                  }
                  if (local_90.baseBound <= dVar28) goto LAB_0029d7ca;
                }
                local_90.delta = dVar28 - local_90.baseBound;
                pNVar16 = local_38;
LAB_0029da5b:
                local_90.delta = local_90.delta * dVar24;
                local_90.prio =
                     ABS((double)(*(long *)((long)pNVar16->_M_t + 0x30 + lVar12 * 0x38) + 1) *
                         (dVar28 - *pdVar13) * dVar24);
                __position._M_current =
                     (this->resolveBuffer).
                     super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (this->resolveBuffer).
                    super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  local_68 = dVar27;
                  uStack_60 = uVar29;
                  std::
                  vector<HighsDomain::ConflictSet::ResolveCandidate,std::allocator<HighsDomain::ConflictSet::ResolveCandidate>>
                  ::_M_realloc_insert<HighsDomain::ConflictSet::ResolveCandidate_const&>
                            (local_48,__position,&local_90);
                  psVar22 = local_70;
                  dVar27 = local_68;
                  uVar29 = uStack_60;
                }
                else {
                  (__position._M_current)->prio = local_90.prio;
                  (__position._M_current)->boundPos = local_90.boundPos;
                  (__position._M_current)->valuePos = local_90.valuePos;
                  (__position._M_current)->delta = local_90.delta;
                  (__position._M_current)->baseBound = local_90.baseBound;
                  ppRVar2 = &(this->resolveBuffer).
                             super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppRVar2 = *ppRVar2 + 1;
                }
              }
            }
          }
        }
LAB_0029d7ca:
        uVar18 = uVar18 + 1;
        dVar26 = maxAct;
      } while (uVar18 != (uint)len);
    }
    if ((dVar27 != 0.0) || (NAN(dVar27))) {
      pRVar4 = (this->resolveBuffer).
               super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pRVar9 = (this->resolveBuffer).
               super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pRVar4 != pRVar9) {
        uVar18 = (long)pRVar9 - (long)pRVar4 >> 5;
        iVar14 = 0;
        if (1 < uVar18) {
          iVar14 = 0;
          do {
            uVar18 = (long)uVar18 >> 1;
            iVar14 = iVar14 + 1;
          } while (1 < uVar18);
        }
        local_68 = dVar27;
        uStack_60 = uVar29;
        pdqsort_detail::
        pdqsort_loop<__gnu_cxx::__normal_iterator<HighsDomain::ConflictSet::ResolveCandidate*,std::vector<HighsDomain::ConflictSet::ResolveCandidate,std::allocator<HighsDomain::ConflictSet::ResolveCandidate>>>,std::less<HighsDomain::ConflictSet::ResolveCandidate>,false>
                  (pRVar4,pRVar9,iVar14,1);
        dVar27 = local_68;
      }
      dVar26 = (domchg->domchg).boundval;
      pHVar10 = this->localdom->mipsolver;
      lVar12 = (long)(domchg->domchg).column;
      _Var5._M_head_impl =
           (pHVar10->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
      if ((pHVar10->model_->integrality_).
          super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
          super__Vector_impl_data._M_start[lVar12] == kContinuous) {
        dVar24 = (_Var5._M_head_impl)->epsilon;
      }
      else {
        dVar24 = (_Var5._M_head_impl)->feastol * -10.0 + 1.0;
      }
      if ((domchg->domchg).boundtype == kLower) {
        dVar26 = dVar26 - dVar24;
      }
      else {
        dVar26 = dVar26 + dVar24;
      }
      lVar17 = 800;
      if (dVar27 < 0.0) {
        lVar17 = 0x308;
      }
      dVar28 = dVar27 * *(double *)
                         (*(long *)((long)&(this->globaldom->changedcolsflags_).
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar17) +
                         lVar12 * 8);
      dVar24 = maxAct - dVar28;
      M.lo = dVar23 + (maxAct - (dVar28 + dVar24)) + (-dVar28 - (dVar24 - (dVar28 + dVar24)));
      M.hi = dVar24;
      bVar11 = resolveLinearGeq(this,M,local_50 - dVar26 * dVar27,vals);
      return bVar11;
    }
  }
  return false;
}

Assistant:

bool HighsDomain::ConflictSet::explainBoundChangeGeq(
    const std::set<LocalDomChg>& currentFrontier, const LocalDomChg& domchg,
    const HighsInt* inds, const double* vals, HighsInt len, double rhs,
    double maxAct) {
  if (maxAct == kHighsInf) return false;

  // get the coefficient value of the column for which we want to explain
  // the bound change
  double domchgVal = 0;

  resolveBuffer.reserve(len);
  resolveBuffer.clear();
  const auto& nodequeue = localdom.mipsolver->mipdata_->nodequeue;
  HighsCDouble M = maxAct;
  for (HighsInt i = 0; i < len; ++i) {
    HighsInt col = inds[i];

    if (col == domchg.domchg.column) {
      domchgVal = vals[i];
      continue;
    }

    ResolveCandidate cand;
    cand.valuePos = i;

    if (vals[i] > 0) {
      double ub = localdom.getColUpperPos(col, domchg.pos, cand.boundPos);
      if (globaldom.col_upper_[col] <= ub || cand.boundPos == -1) continue;
      auto it =
          currentFrontier.find(LocalDomChg{cand.boundPos, HighsDomainChange()});
      if (it != currentFrontier.end()) {
        cand.baseBound = it->domchg.boundval;
        if (cand.baseBound != globaldom.col_upper_[col])
          M += vals[i] * (cand.baseBound - globaldom.col_upper_[col]);
        if (cand.baseBound <= ub) continue;
      } else
        cand.baseBound = globaldom.col_upper_[col];

      cand.delta = vals[i] * (ub - cand.baseBound);
      cand.prio = computePrio(vals[i], ub, globaldom.col_upper_[col],
                              nodequeue.numNodesDown(col));
    } else {
      double lb = localdom.getColLowerPos(col, domchg.pos, cand.boundPos);
      if (globaldom.col_lower_[col] >= lb || cand.boundPos == -1) continue;
      auto it =
          currentFrontier.find(LocalDomChg{cand.boundPos, HighsDomainChange()});

      if (it != currentFrontier.end()) {
        cand.baseBound = it->domchg.boundval;
        if (cand.baseBound != globaldom.col_lower_[col])
          M += vals[i] * (cand.baseBound - globaldom.col_lower_[col]);
        if (cand.baseBound >= lb) continue;
      } else
        cand.baseBound = globaldom.col_lower_[col];

      cand.delta = vals[i] * (lb - cand.baseBound);
      cand.prio = computePrio(vals[i], lb, globaldom.col_lower_[col],
                              nodequeue.numNodesUp(col));
    }

    resolveBuffer.push_back(cand);
  }

  if (domchgVal == 0) return false;

  pdqsort(resolveBuffer.begin(), resolveBuffer.end());

  // to explain the bound change we start from the bound constraint,
  // multiply it by the columns coefficient in the constraint. Then the
  // bound constraint is a0 * x0 >= b0 and the constraint
  // a0 * x0 + \sum ai * xi >= b. Let the max activity of \sum ai xi be M,
  // then the constraint yields the bound a0 * x0 >= b - M. If M is
  // sufficiently small the bound constraint is implied. Therefore we
  // decrease M by updating it with the stronger local bounds until
  // M <= b - b0 holds.
  double b0 = domchg.domchg.boundval;
  if (localdom.mipsolver->variableType(domchg.domchg.column) !=
      HighsVarType::kContinuous) {
    // in case of an integral variable the bound was rounded and can be
    // relaxed by 1-feastol. We use 1 - 10 * feastol for numerical safety.
    if (domchg.domchg.boundtype == HighsBoundType::kLower)
      b0 -= (1.0 - 10 * localdom.mipsolver->mipdata_->feastol);
    else
      b0 += (1.0 - 10 * localdom.mipsolver->mipdata_->feastol);
  } else {
    // for a continuous variable we relax the bound by epsilon to
    // accommodate for tiny rounding errors
    if (domchg.domchg.boundtype == HighsBoundType::kLower)
      b0 -= localdom.mipsolver->mipdata_->epsilon;
    else
      b0 += localdom.mipsolver->mipdata_->epsilon;
  }

  // now multiply the bound constraint with the coefficient value in the
  // constraint to obtain b0
  b0 *= domchgVal;

  // compute the lower bound of M that is necessary
  double Mupper = rhs - b0;

  // M is the current residual activity initially
  if (domchgVal < 0)
    M -= domchgVal * globaldom.col_lower_[domchg.domchg.column];
  else
    M -= domchgVal * globaldom.col_upper_[domchg.domchg.column];

  return resolveLinearGeq(M, Mupper, vals);
}